

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::Parse_Digits_Backtrack(int i)

{
  Parse3Digits(i,Parse3Backtrack);
  return;
}

Assistant:

void Parse_Digits_Backtrack(int i)   { Parse3Digits(i, Parse3Backtrack); }